

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  bool bVar1;
  const_iterator cVar2;
  Type *pTVar3;
  WrappedMutex *mu;
  Type TVar5;
  Symbol SVar6;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  pointer local_38;
  anon_union_8_8_13f84498_for_Symbol_2 aVar4;
  
  if (this->pool_ == pool) {
    mu = (Mutex *)0x0;
  }
  else {
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_40,mu);
  local_38 = (name->_M_dataplus)._M_p;
  cVar2 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((pool->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->symbols_by_name_)._M_h,&local_38);
  pTVar3 = (Type *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                          ._M_cur + 0x10);
  if (cVar2.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    pTVar3 = &(anonymous_namespace)::kNullSymbol;
  }
  aVar4 = (anon_union_8_8_13f84498_for_Symbol_2)
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2))->descriptor;
  TVar5 = *pTVar3;
  if (TVar5 == NULL_SYMBOL) {
    if (pool->underlay_ == (DescriptorPool *)0x0) {
      TVar5 = NULL_SYMBOL;
    }
    else {
      SVar6 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name,true);
      aVar4 = SVar6.field_1;
      TVar5 = SVar6.type;
    }
    if (build_it && TVar5 == NULL_SYMBOL) {
      bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name);
      TVar5 = NULL_SYMBOL;
      if (bVar1) {
        local_38 = (name->_M_dataplus)._M_p;
        cVar2 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(((pool->tables_)._M_t.
                          super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                         _M_head_impl)->symbols_by_name_)._M_h,&local_38);
        pTVar3 = (Type *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                                ._M_cur + 0x10);
        if (cVar2.
            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
            _M_cur == (__node_type *)0x0) {
          pTVar3 = &(anonymous_namespace)::kNullSymbol;
        }
        aVar4 = (anon_union_8_8_13f84498_for_Symbol_2)
                ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar3 + 2))->descriptor;
        TVar5 = *pTVar3;
      }
    }
  }
  if ((pthread_mutex_t *)local_40.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_40.mu_);
  }
  SVar6._4_4_ = 0;
  SVar6.type = TVar5;
  SVar6.field_1.descriptor = aVar4.descriptor;
  return SVar6;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const std::string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? nullptr : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}